

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O0

int process_metadata(WavpackContext *wpc,WavpackMetadata *wpmd)

{
  uint uVar1;
  WavpackStream *wpc_00;
  WavpackMetadata *wpmd_00;
  WavpackStream *in_RSI;
  WavpackContext *in_RDI;
  WavpackStream *unaff_retaddr;
  WavpackStream *wps;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  wpc_00 = &in_RDI->stream;
  wpmd_00 = (WavpackMetadata *)(ulong)(byte)(in_RSI->wphdr).block_index;
  switch(wpmd_00) {
  case (WavpackMetadata *)0x0:
    uVar1 = 1;
    break;
  default:
    uVar1 = (uint)(((in_RSI->wphdr).block_index & 0x20) != 0);
    break;
  case (WavpackMetadata *)0x2:
    uVar1 = read_decorr_terms(wpc_00,(WavpackMetadata *)in_RSI);
    break;
  case (WavpackMetadata *)0x3:
    uVar1 = read_decorr_weights((WavpackStream *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (WavpackMetadata *)in_RDI);
    break;
  case (WavpackMetadata *)0x4:
    uVar1 = read_decorr_samples(unaff_retaddr,
                                (WavpackMetadata *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    break;
  case (WavpackMetadata *)0x5:
    uVar1 = read_entropy_vars(in_RSI,(WavpackMetadata *)wpc_00);
    break;
  case (WavpackMetadata *)0x6:
    uVar1 = read_hybrid_profile(in_RSI,(WavpackMetadata *)wpc_00);
    break;
  case (WavpackMetadata *)0x7:
  case (WavpackMetadata *)0xb:
  case (WavpackMetadata *)0xc:
    uVar1 = 1;
    break;
  case (WavpackMetadata *)0x8:
    uVar1 = read_float_info(wpc_00,(WavpackMetadata *)in_RSI);
    break;
  case (WavpackMetadata *)0x9:
    uVar1 = read_int32_info(wpc_00,(WavpackMetadata *)in_RSI);
    break;
  case (WavpackMetadata *)0xa:
    uVar1 = init_wv_bitstream((WavpackContext *)wpc_00,wpmd_00);
    break;
  case (WavpackMetadata *)0xd:
    uVar1 = read_channel_info(in_RDI,(WavpackMetadata *)in_RSI);
    break;
  case (WavpackMetadata *)0x25:
    uVar1 = read_config_info(in_RDI,(WavpackMetadata *)in_RSI);
  }
  return uVar1;
}

Assistant:

int process_metadata (WavpackContext *wpc, WavpackMetadata *wpmd)
{
    WavpackStream *wps = &wpc->stream;

    switch (wpmd->id) {
        case ID_DUMMY:
            return TRUE;

        case ID_DECORR_TERMS:
            return read_decorr_terms (wps, wpmd);

        case ID_DECORR_WEIGHTS:
            return read_decorr_weights (wps, wpmd);

        case ID_DECORR_SAMPLES:
            return read_decorr_samples (wps, wpmd);

        case ID_ENTROPY_VARS:
            return read_entropy_vars (wps, wpmd);

        case ID_HYBRID_PROFILE:
            return read_hybrid_profile (wps, wpmd);

        case ID_FLOAT_INFO:
            return read_float_info (wps, wpmd);

        case ID_INT32_INFO:
            return read_int32_info (wps, wpmd);

        case ID_CHANNEL_INFO:
            return read_channel_info (wpc, wpmd);

        case ID_CONFIG_BLOCK:
            return read_config_info (wpc, wpmd);

        case ID_WV_BITSTREAM:
            return init_wv_bitstream (wpc, wpmd);

        case ID_SHAPING_WEIGHTS:
        case ID_WVC_BITSTREAM:
        case ID_WVX_BITSTREAM:
            return TRUE;

        default:
            return (wpmd->id & ID_OPTIONAL_DATA) ? TRUE : FALSE;
    }
}